

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

string * leveldb::DescriptorFileName(string *dbname,uint64_t number)

{
  long lVar1;
  long in_RDX;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  char buf [100];
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == 0) {
    __assert_fail("number > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/filename.cc"
                  ,0x2c,"std::string leveldb::DescriptorFileName(const std::string &, uint64_t)");
  }
  snprintf(&stack0xffffffffffffff88,100,"/MANIFEST-%06llu",in_RDX,in_R8,in_R9,
           &stack0xffffffffffffff88);
  std::operator+(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string DescriptorFileName(const std::string& dbname, uint64_t number) {
  assert(number > 0);
  char buf[100];
  snprintf(buf, sizeof(buf), "/MANIFEST-%06llu",
           static_cast<unsigned long long>(number));
  return dbname + buf;
}